

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 gen_dest_fpr_F(DisasContext_conflict8 *dc)

{
  int iVar1;
  TCGContext_conflict8 *s;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  
  if ((uint)dc->n_t32 < 3) {
    s = dc->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar2 - (long)s);
    iVar1 = dc->n_t32;
    dc->n_t32 = iVar1 + 1;
    dc->t32[iVar1] = pTVar3;
    return pTVar3;
  }
  __assert_fail("dc->n_t32 < ARRAY_SIZE(dc->t32)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                ,0x73,"TCGv_i32 get_temp_i32(DisasContext *)");
}

Assistant:

static inline TCGv_i32 get_temp_i32(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    TCGv_i32 t;
    assert(dc->n_t32 < ARRAY_SIZE(dc->t32));
    dc->t32[dc->n_t32++] = t = tcg_temp_new_i32(tcg_ctx);
    return t;
}